

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,double frustum_depth,double *scale)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  double x;
  double local_30;
  double local_28;
  undefined8 uStack_20;
  
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  if (this->m_bValidFrustum == false) {
    return false;
  }
  if (this->m_bValidPort == false) {
    return false;
  }
  local_28 = 1.0;
  uStack_20 = 0;
  if ((this->m_projection == perspective_view) &&
     (bVar2 = ON_IsValid(frustum_depth), 0.0 < frustum_depth && bVar2)) {
    if (this->m_frus_near <= 0.0) {
      return false;
    }
    local_28 = frustum_depth / this->m_frus_near;
    dVar5 = ABS(local_28);
    uStack_20 = 0;
    if ((0x3fe < (uint)((ulong)((long)dVar5 + -0x10000000000000) >> 0x35) || (long)local_28 < 0) &&
        ((0xffffffffffffe < (long)local_28 - 1U && (long)dVar5 < 0x7ff0000000000001) &&
        (dVar5 != 0.0 && dVar5 != INFINITY))) {
      return false;
    }
  }
  local_30 = 1.0;
  GetViewScale(this,&local_30,(double *)0x0,(double *)0x0);
  dVar5 = this->m_frus_right - this->m_frus_left;
  if (dVar5 == 0.0) {
    return false;
  }
  iVar3 = this->m_port_right - this->m_port_left;
  if (iVar3 == 0) {
    return false;
  }
  iVar1 = -iVar3;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  dVar5 = (double)iVar1 /
          (ABS(dVar5) *
          (double)(~-(ulong)(local_30 != 0.0) & (ulong)local_28 |
                  (-(ulong)(local_30 != 1.0) & (ulong)(local_28 / ABS(local_30)) |
                  ~-(ulong)(local_30 != 1.0) & (ulong)local_28) & -(ulong)(local_30 != 0.0)));
  bVar8 = -1 < (long)dVar5;
  dVar4 = ABS(dVar5);
  bVar6 = 0xffffffffffffe < (long)dVar4 - 1U;
  bVar7 = 0x3fe < (uint)((ulong)((long)dVar4 + -0x10000000000000) >> 0x35);
  bVar2 = (bVar7 || bVar8) && (dVar4 != 0.0 && (bVar6 || bVar8));
  if (scale != (double *)0x0) {
    if ((bVar7 || bVar8) && (dVar4 != 0.0 && (bVar6 || bVar8))) {
      *scale = dVar5;
      return true;
    }
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  double frustum_depth,
  double* scale
  ) const
{
  if (nullptr != scale)
    *scale = 0.0;

  if (false == m_bValidFrustum)
    return false;

  if (false == m_bValidPort)
    return false;

  double s = 1.0;

  if (IsPerspectiveProjection() && ON_IsValid(frustum_depth) && frustum_depth > 0.0)
  {
    if (!(m_frus_near > 0.0))
      return false;
    s = frustum_depth / m_frus_near;
    if (!(s >= 0.0) && ON_IS_FINITE(s))
      return false;
  }

  double x = 1.0;
  GetViewScale(&x, nullptr);
  if (x != 0.0 && 1.0 != x)
    s /= fabs(x);

  double fw = fabs(FrustumWidth());
  if (!(fw > 0.0))
    return false;

  fw *= s;

  double sw = fabs((double)ScreenPortWidth());
  if (!(sw > 0.0))
    return false;

  s = sw / fw;
  if (!(s > 0.0) && ON_IS_FINITE(s))
    return false;

  if (nullptr != scale)
    *scale = s;

  return true;
}